

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O1

int Maj3_ManAddConstraintsLazy(Maj3_Man_t *p)

{
  bool bVar1;
  int iVar2;
  int i;
  int (*plits) [32];
  bmcg_sat_solver *s;
  int iVar3;
  int pFanins [32];
  int aiStack_b8 [34];
  
  i = p->nVars + 1;
  iVar3 = 0;
  if (i < p->nObjs) {
    iVar3 = 0;
    do {
      iVar2 = Maj3_ManFindFanin(p,i,aiStack_b8);
      if (iVar2 == 3) {
        bVar1 = false;
      }
      else {
        iVar3 = iVar3 + 1;
        if (iVar2 < 3) {
          iVar2 = p->nLits[0];
          if (iVar2 < 1) {
            __assert_fail("p->nLits[0] > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                          ,0x185,"int Maj3_ManAddConstraintsLazy(Maj3_Man_t *)");
          }
          s = p->pSat;
          plits = p->pLits;
        }
        else {
          iVar2 = 4 - p->nLits[2];
          if (p->nLits[1] <= iVar2) {
            iVar2 = p->nLits[1];
          }
          if (iVar2 < 1) {
            __assert_fail("nLits > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                          ,0x18d,"int Maj3_ManAddConstraintsLazy(Maj3_Man_t *)");
          }
          s = p->pSat;
          plits = p->pLits + 1;
        }
        iVar2 = bmcg_sat_solver_addclause(s,*plits,iVar2);
        if (iVar2 == 0) {
          bVar1 = true;
        }
        else {
          bVar1 = false;
        }
      }
      if (bVar1) {
        return -1;
      }
      i = i + 1;
    } while (i < p->nObjs);
  }
  return iVar3;
}

Assistant:

int Maj3_ManAddConstraintsLazy( Maj3_Man_t * p )
{
    int i, pFanins[MAJ3_OBJS], nConstr = 0;
    //Maj3_ManVarMapPrint( p );
    for ( i = p->nVars+1; i < p->nObjs; i++ )
    {
        int nFanins = Maj3_ManFindFanin( p, i, pFanins );
        if ( nFanins == 3 )
            continue;
        //printf( "Node %d has %d fanins.\n", i, nFanins );
        nConstr++;
        if ( nFanins < 3 )
        {
            assert( p->nLits[0] > 0 );
            //Maj3_PrintClause( p->pLits[0], p->nLits[0] );
            if ( !bmcg_sat_solver_addclause( p->pSat, p->pLits[0], p->nLits[0] ) )
                return -1;
        }
        else if ( nFanins > 3 )
        {
            int nLits = Abc_MinInt(4 - p->nLits[2], p->nLits[1]);
            assert( nLits > 0 );
            //Maj3_PrintClause( p->pLits[1], nLits );
            if ( !bmcg_sat_solver_addclause( p->pSat, p->pLits[1], nLits ) )
                return -1;
        }
    }
    return nConstr;
}